

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

void snap_restoreval(jit_State *J,GCtrace *T,ExitState *ex,SnapNo snapno,BloomFilter rfilt,IRRef ref
                    ,TValue *o)

{
  IRIns *ir;
  IRIns *pIVar1;
  uint uVar2;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 aVar3;
  TValue TVar4;
  uint uVar5;
  ulong uVar6;
  lua_Number lVar7;
  
  uVar6 = (ulong)ref;
  pIVar1 = T->ir;
  do {
    ir = pIVar1 + uVar6;
    if ((uint)uVar6 < 0x8000) {
      if ((ir->field_1).o != '\x19') {
        lj_ir_kvalue(J->L,o,ir);
        return;
      }
      TVar4.field_2.it = 0;
      TVar4.field_2.field_0 =
           (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)(ir->field_1).op12;
LAB_00141bda:
      *o = TVar4;
      return;
    }
    uVar2 = (uint)*(ushort *)((long)pIVar1 + uVar6 * 8 + 6);
    if ((rfilt >> (uVar6 & 0x3f) & 1) != 0) {
      uVar2 = snap_renameref(T,snapno,(uint)uVar6,uVar2);
    }
    if (0xff < uVar2) {
      uVar2 = uVar2 >> 8;
      uVar5 = (ir->field_1).t.irt & 0x1f;
      if (uVar5 - 0xf < 5) {
        lVar7 = (lua_Number)ex->spill[uVar2];
        goto LAB_00141bad;
      }
      if (((char)uVar5 != '\x03') && (uVar5 != 0xe)) {
        aVar3 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
                 (ex->spill + uVar2);
LAB_00141be9:
        (o->field_2).field_0 = aVar3;
LAB_00141bed:
        (o->field_2).it = ~uVar5;
        return;
      }
      TVar4 = *(TValue *)(ex->spill + uVar2);
      goto LAB_00141bda;
    }
    if (uVar2 < 0x80) {
      uVar5 = (ir->field_1).t.irt & 0x1f;
      if (uVar5 - 0xf < 5) {
        lVar7 = (lua_Number)(int)ex->gpr[uVar2];
LAB_00141bad:
        o->n = lVar7;
        return;
      }
      if ((byte)uVar5 == 0xe) {
        lVar7 = ex->fpr[uVar2 - 0x10];
        goto LAB_00141bad;
      }
      if ((0x604208U >> uVar5 & 1) == 0) {
        if ((byte)uVar5 < 3) goto LAB_00141bed;
        aVar3 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
                 (ex->gpr + uVar2);
        goto LAB_00141be9;
      }
      TVar4 = *(TValue *)(ex->gpr + uVar2);
      goto LAB_00141bda;
    }
    uVar6 = (ulong)(ir->field_0).op1;
  } while( true );
}

Assistant:

static void snap_restoreval(jit_State *J, GCtrace *T, ExitState *ex,
			    SnapNo snapno, BloomFilter rfilt,
			    IRRef ref, TValue *o)
{
  IRIns *ir = &T->ir[ref];
  IRType1 t = ir->t;
  RegSP rs = ir->prev;
  if (irref_isk(ref)) {  /* Restore constant slot. */
    if (ir->o == IR_KPTR) {
      o->u64 = (uint64_t)(uintptr_t)ir_kptr(ir);
    } else {
      lj_assertJ(!(ir->o == IR_KKPTR || ir->o == IR_KNULL),
		 "restore of const from IR %04d with bad op %d",
		 ref - REF_BIAS, ir->o);
      lj_ir_kvalue(J->L, o, ir);
    }
    return;
  }
  if (LJ_UNLIKELY(bloomtest(rfilt, ref)))
    rs = snap_renameref(T, snapno, ref, rs);
  if (ra_hasspill(regsp_spill(rs))) {  /* Restore from spill slot. */
    int32_t *sps = &ex->spill[regsp_spill(rs)];
    if (irt_isinteger(t)) {
      setintV(o, *sps);
#if !LJ_SOFTFP32
    } else if (irt_isnum(t)) {
      o->u64 = *(uint64_t *)sps;
#endif
#if LJ_64 && !LJ_GC64
    } else if (irt_islightud(t)) {
      /* 64 bit lightuserdata which may escape already has the tag bits. */
      o->u64 = *(uint64_t *)sps;
#endif
    } else {
      lj_assertJ(!irt_ispri(t), "PRI ref with spill slot");
      setgcV(J->L, o, (GCobj *)(uintptr_t)*(GCSize *)sps, irt_toitype(t));
    }
  } else {  /* Restore from register. */
    Reg r = regsp_reg(rs);
    if (ra_noreg(r)) {
      lj_assertJ(ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT,
		 "restore from IR %04d has no reg", ref - REF_BIAS);
      snap_restoreval(J, T, ex, snapno, rfilt, ir->op1, o);
      if (LJ_DUALNUM) setnumV(o, (lua_Number)intV(o));
      return;
    } else if (irt_isinteger(t)) {
      setintV(o, (int32_t)ex->gpr[r-RID_MIN_GPR]);
#if !LJ_SOFTFP
    } else if (irt_isnum(t)) {
      setnumV(o, ex->fpr[r-RID_MIN_FPR]);
#elif LJ_64  /* && LJ_SOFTFP */
    } else if (irt_isnum(t)) {
      o->u64 = ex->gpr[r-RID_MIN_GPR];
#endif
#if LJ_64 && !LJ_GC64
    } else if (irt_is64(t)) {
      /* 64 bit values that already have the tag bits. */
      o->u64 = ex->gpr[r-RID_MIN_GPR];
#endif
    } else if (irt_ispri(t)) {
      setpriV(o, irt_toitype(t));
    } else {
      setgcV(J->L, o, (GCobj *)ex->gpr[r-RID_MIN_GPR], irt_toitype(t));
    }
  }
}